

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-packed-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase392::run(TestCase392 *this)

{
  Reader reader_00;
  size_t sVar1;
  size_t sVar2;
  ArrayPtr<const_unsigned_char> AVar3;
  ArrayPtr<const_unsigned_char> packedBytes;
  ReaderOptions options;
  undefined8 in_stack_ffffffffffffdc68;
  Reader local_2348;
  ArrayPtr<capnp::word> local_2318;
  ReaderOptions local_2308;
  undefined1 local_22f8 [8];
  PackedMessageReader reader;
  word scratch [1024];
  size_t local_1a8;
  size_t local_1a0;
  bool local_191;
  undefined1 auStack_190 [7];
  bool _kj_shouldLog;
  size_t local_188;
  undefined1 local_180 [8];
  TestPipe pipe;
  Builder local_130;
  undefined1 local_108 [8];
  TestMessageBuilder builder;
  TestCase392 *this_local;
  
  builder._240_8_ = this;
  TestMessageBuilder::TestMessageBuilder((TestMessageBuilder *)local_108,1);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            (&local_130,(MessageBuilder *)local_108);
  TestPipe::TestPipe((TestPipe *)local_180);
  writePackedMessage((OutputStream *)&pipe,(MessageBuilder *)local_108);
  sVar1 = computeSerializedSizeInWords((MessageBuilder *)local_108);
  _auStack_190 = TestPipe::getArray((TestPipe *)local_180);
  AVar3.size_ = (uchar *)auStack_190._8_8_;
  AVar3.ptr = AVar3.size_;
  sVar2 = computeUnpackedSizeInWords((capnp *)auStack_190._0_8_,AVar3);
  if (sVar1 != sVar2) {
    local_191 = kj::_::Debug::shouldLog(ERROR);
    while (local_191 != false) {
      local_1a0 = computeSerializedSizeInWords((MessageBuilder *)local_108);
      AVar3 = TestPipe::getArray((TestPipe *)local_180);
      packedBytes.size_ = (uchar *)AVar3.size_;
      packedBytes.ptr = packedBytes.size_;
      local_1a8 = computeUnpackedSizeInWords((capnp *)AVar3.ptr,packedBytes);
      kj::_::Debug::log<char_const(&)[106],unsigned_long,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-packed-test.c++"
                 ,399,ERROR,
                 "\"failed: expected \" \"(computeSerializedSizeInWords(builder)) == (computeUnpackedSizeInWords(pipe.getArray()))\", computeSerializedSizeInWords(builder), computeUnpackedSizeInWords(pipe.getArray())"
                 ,(char (*) [106])
                  "failed: expected (computeSerializedSizeInWords(builder)) == (computeUnpackedSizeInWords(pipe.getArray()))"
                 ,&local_1a0,&local_1a8);
      local_191 = false;
    }
  }
  local_2308.traversalLimitInWords = 0;
  local_2308.nestingLimit = 0;
  local_2308._12_4_ = 0;
  ReaderOptions::ReaderOptions(&local_2308);
  kj::ArrayPtr<capnp::word>::ArrayPtr
            (&local_2318,(word *)&reader.super_InputStreamMessageReader.unwindDetector,0x400);
  options.nestingLimit = local_2308.nestingLimit;
  options.traversalLimitInWords = local_2308.traversalLimitInWords;
  options._12_4_ = 0;
  PackedMessageReader::PackedMessageReader
            ((PackedMessageReader *)local_22f8,(BufferedInputStream *)local_180,options,local_2318);
  MessageReader::getRoot<capnproto_test::capnp::test::TestAllTypes>
            (&local_2348,(MessageReader *)&reader.super_PackedInputStream.inner);
  reader_00._reader.capTable = (CapTableReader *)local_2348._reader.data;
  reader_00._reader.segment = (SegmentReader *)local_2348._reader.capTable;
  reader_00._reader.data = local_2348._reader.pointers;
  reader_00._reader.pointers = (WirePointer *)local_2348._reader._32_8_;
  reader_00._reader.dataSize = local_2348._reader.nestingLimit;
  reader_00._reader.pointerCount = local_2348._reader._44_2_;
  reader_00._reader._38_2_ = local_2348._reader._46_2_;
  reader_00._reader._40_8_ = in_stack_ffffffffffffdc68;
  checkTestMessageAllZero(reader_00);
  PackedMessageReader::~PackedMessageReader((PackedMessageReader *)local_22f8);
  TestPipe::~TestPipe((TestPipe *)local_180);
  TestMessageBuilder::~TestMessageBuilder((TestMessageBuilder *)local_108);
  return;
}

Assistant:

TEST(Packed, RoundTripAllZeroScratchSpace) {
  TestMessageBuilder builder(1);
  builder.initRoot<TestAllTypes>();

  TestPipe pipe;
  writePackedMessage(pipe, builder);

  EXPECT_EQ(computeSerializedSizeInWords(builder), computeUnpackedSizeInWords(pipe.getArray()));

  word scratch[1024];
  PackedMessageReader reader(pipe, ReaderOptions(), kj::ArrayPtr<word>(scratch, 1024));
  checkTestMessageAllZero(reader.getRoot<TestAllTypes>());
}